

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::makeBrandedDependencies
          (Impl *this,RawSchema *schema,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *bindings)

{
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
  *paVar1;
  short sVar2;
  long lVar3;
  Reader type;
  Reader brand;
  Reader type_00;
  Reader brand_00;
  Reader brand_01;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar4;
  ulong uVar5;
  RawBrandedSchema *pRVar6;
  Dependency *pDVar7;
  RawSchema *schema_00;
  uint64_t uVar8;
  ElementCount index;
  unsigned_long i;
  ulong uVar9;
  Dependency *__i;
  long lVar10;
  Dependency *pDVar11;
  StringPtr scopeName;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar12;
  StringPtr name;
  Vector<capnp::_::RawBrandedSchema::Dependency> deps;
  Reader node;
  Reader superclass;
  Reader superclasses;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1d0;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1b8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1a0;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_188;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_170;
  Reader interface;
  Reader local_120;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  readMessageUnchecked<capnp::schema::Node>(&node,schema->encodedNode);
  scopeName.content = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&node);
  deps.builder.ptr = (Dependency *)0x0;
  deps.builder.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
  deps.builder.endPtr = (Dependency *)0x0;
  readMessageUnchecked<capnp::schema::Node>(&node,schema->encodedNode);
  if (0x6f < node._reader.dataSize) {
    sVar2 = *(short *)((long)node._reader.data + 0xc);
    if (sVar2 == 1) {
      superclasses.reader.structPointerCount = node._reader.pointerCount;
      superclasses.reader._38_2_ = node._reader._38_2_;
      superclasses.reader.structDataSize = node._reader.dataSize;
      superclasses.reader.nestingLimit = node._reader.nestingLimit;
      superclasses.reader._44_4_ = node._reader._44_4_;
      superclasses.reader.ptr = (byte *)node._reader.data;
      superclasses.reader._24_8_ = node._reader.pointers;
      superclasses.reader.segment = node._reader.segment;
      superclasses.reader.capTable = node._reader.capTable;
      capnp::schema::Node::Struct::Reader::getFields((Reader *)&interface,(Reader *)&superclasses);
      uVar5 = (ulong)interface._reader.pointers & 0xffffffff;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        _::ListReader::getStructElement
                  ((StructReader *)&superclasses,(ListReader *)&interface,(ElementCount)uVar9);
        if (superclasses.reader.structDataSize < 0x50) {
LAB_001fdb99:
          superclass._reader.dataSize = superclasses.reader.structDataSize;
          superclass._reader.pointerCount = superclasses.reader.structPointerCount;
          superclass._reader._38_1_ = superclasses.reader.elementSize;
          superclass._reader._39_1_ = superclasses.reader._39_1_;
          superclass._reader.nestingLimit = superclasses.reader.nestingLimit;
          superclass._reader._44_4_ = superclasses.reader._44_4_;
          superclass._reader.data = superclasses.reader.ptr;
          superclass._reader.pointers = (WirePointer *)superclasses.reader._24_8_;
          superclass._reader.segment = superclasses.reader.segment;
          superclass._reader.capTable = superclasses.reader.capTable;
          capnp::schema::Field::Slot::Reader::getType(&local_90,(Reader *)&superclass);
          local_188.ptr.isSet = (bindings->ptr).isSet;
          if (local_188.ptr.isSet == true) {
            local_188.ptr.field_1.value.ptr = (bindings->ptr).field_1.value.ptr;
            local_188.ptr.field_1.value.size_ = (bindings->ptr).field_1.value.size_;
          }
          type_00._reader.capTable = local_90._reader.capTable;
          type_00._reader.segment = local_90._reader.segment;
          type_00._reader.data = local_90._reader.data;
          type_00._reader.pointers = local_90._reader.pointers;
          type_00._reader.dataSize = local_90._reader.dataSize;
          type_00._reader.pointerCount = local_90._reader.pointerCount;
          type_00._reader._38_2_ = local_90._reader._38_2_;
          type_00._reader.nestingLimit = local_90._reader.nestingLimit;
          type_00._reader._44_4_ = local_90._reader._44_4_;
          pRVar6 = makeDepSchema(this,type_00,scopeName,&local_188);
          if (pRVar6 != (RawBrandedSchema *)0x0) {
            pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
LAB_001fdc52:
            *(undefined8 *)pDVar7 = 0;
            pDVar7->location = (ElementCount)uVar9 | 0x1000000;
            pDVar7->schema = pRVar6;
          }
        }
        else {
          if (*(short *)(superclasses.reader.ptr + 8) == 0) goto LAB_001fdb99;
          if (*(short *)(superclasses.reader.ptr + 8) == 1) {
            if (superclasses.reader.structDataSize < 0xc0) {
              uVar8 = 0;
            }
            else {
              uVar8 = *(uint64_t *)(superclasses.reader.ptr + 0x10);
            }
            name.content.size_ = 0x15;
            name.content.ptr = "(unknown group type)";
            schema_00 = loadEmpty(this,uVar8,name,STRUCT,true);
            if ((bindings->ptr).isSet != true) {
              pRVar6 = getUnbound(this,schema_00);
              if (pRVar6 != (RawBrandedSchema *)0x0) {
                pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
                goto LAB_001fdc52;
              }
              goto LAB_001fdc64;
            }
            pRVar6 = makeBranded(this,schema_00,(bindings->ptr).field_1.value);
            if (pRVar6 == (RawBrandedSchema *)0x0) goto LAB_001fdc64;
            pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
            goto LAB_001fdc52;
          }
        }
LAB_001fdc64:
      }
    }
    else if (sVar2 == 3) {
      interface._reader.nestingLimit = node._reader.nestingLimit;
      interface._reader._44_4_ = node._reader._44_4_;
      interface._reader.data = node._reader.data;
      interface._reader.pointers = node._reader.pointers;
      interface._reader.segment = node._reader.segment;
      interface._reader.capTable = node._reader.capTable;
      capnp::schema::Node::Interface::Reader::getSuperclasses(&superclasses,&interface);
      uVar9 = superclasses.reader._24_8_ & 0xffffffff;
      paVar1 = &(bindings->ptr).field_1;
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        _::ListReader::getStructElement
                  (&superclass._reader,&superclasses.reader,(ElementCount)uVar5);
        if (superclass._reader.dataSize < 0x40) {
          uVar8 = 0;
        }
        else {
          uVar8 = *superclass._reader.data;
        }
        capnp::schema::Superclass::Reader::getBrand(&local_c0,(Reader *)&superclass._reader);
        local_1a0.ptr.isSet = (bindings->ptr).isSet;
        if (local_1a0.ptr.isSet == true) {
          local_1a0.ptr.field_1.value.ptr = (paVar1->value).ptr;
          local_1a0.ptr.field_1.value.size_ = (bindings->ptr).field_1.value.size_;
        }
        brand._reader.capTable = local_c0._reader.capTable;
        brand._reader.segment = local_c0._reader.segment;
        brand._reader.data = local_c0._reader.data;
        brand._reader.pointers = local_c0._reader.pointers;
        brand._reader.dataSize = local_c0._reader.dataSize;
        brand._reader.pointerCount = local_c0._reader.pointerCount;
        brand._reader._38_2_ = local_c0._reader._38_2_;
        brand._reader.nestingLimit = local_c0._reader.nestingLimit;
        brand._reader._44_4_ = local_c0._reader._44_4_;
        pRVar6 = makeDepSchema(this,uVar8,INTERFACE,INTERFACE,brand,scopeName,&local_1a0);
        if (pRVar6 != (RawBrandedSchema *)0x0) {
          pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
          *(undefined8 *)pDVar7 = 0;
          pDVar7->location = (ElementCount)uVar5 | 0x4000000;
          pDVar7->schema = pRVar6;
        }
      }
      capnp::schema::Node::Interface::Reader::getMethods((Reader *)&superclasses,&interface);
      uVar5 = superclasses.reader._24_8_ & 0xffffffff;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        index = (ElementCount)uVar9;
        _::ListReader::getStructElement(&superclass._reader,&superclasses.reader,index);
        if (superclass._reader.dataSize < 0x80) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(uint64_t *)((long)superclass._reader.data + 8);
        }
        capnp::schema::Method::Reader::getParamBrand(&local_f0,(Reader *)&superclass._reader);
        local_1b8.ptr.isSet = (bindings->ptr).isSet;
        if (local_1b8.ptr.isSet == true) {
          local_1b8.ptr.field_1.value.ptr = (paVar1->value).ptr;
          local_1b8.ptr.field_1.value.size_ = (bindings->ptr).field_1.value.size_;
        }
        brand_00._reader.capTable = local_f0._reader.capTable;
        brand_00._reader.segment = local_f0._reader.segment;
        brand_00._reader.data = local_f0._reader.data;
        brand_00._reader.pointers = local_f0._reader.pointers;
        brand_00._reader.dataSize = local_f0._reader.dataSize;
        brand_00._reader.pointerCount = local_f0._reader.pointerCount;
        brand_00._reader._38_2_ = local_f0._reader._38_2_;
        brand_00._reader.nestingLimit = local_f0._reader.nestingLimit;
        brand_00._reader._44_4_ = local_f0._reader._44_4_;
        pRVar6 = makeDepSchema(this,uVar8,STRUCT,STRUCT,brand_00,scopeName,&local_1b8);
        if (pRVar6 != (RawBrandedSchema *)0x0) {
          pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
          *(undefined8 *)pDVar7 = 0;
          pDVar7->location = index | 0x2000000;
          pDVar7->schema = pRVar6;
        }
        if (superclass._reader.dataSize < 0xc0) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(uint64_t *)((long)superclass._reader.data + 0x10);
        }
        capnp::schema::Method::Reader::getResultBrand(&local_120,(Reader *)&superclass._reader);
        local_1d0.ptr.isSet = (bindings->ptr).isSet;
        if (local_1d0.ptr.isSet == true) {
          local_1d0.ptr.field_1.value.ptr = (paVar1->value).ptr;
          local_1d0.ptr.field_1.value.size_ = (bindings->ptr).field_1.value.size_;
        }
        brand_01._reader.capTable = local_120._reader.capTable;
        brand_01._reader.segment = local_120._reader.segment;
        brand_01._reader.data = local_120._reader.data;
        brand_01._reader.pointers = local_120._reader.pointers;
        brand_01._reader.dataSize = local_120._reader.dataSize;
        brand_01._reader.pointerCount = local_120._reader.pointerCount;
        brand_01._reader._38_2_ = local_120._reader._38_2_;
        brand_01._reader.nestingLimit = local_120._reader.nestingLimit;
        brand_01._reader._44_4_ = local_120._reader._44_4_;
        pRVar6 = makeDepSchema(this,uVar8,STRUCT,STRUCT,brand_01,scopeName,&local_1d0);
        if (pRVar6 != (RawBrandedSchema *)0x0) {
          pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
          *(undefined8 *)pDVar7 = 0;
          pDVar7->location = index | 0x3000000;
          pDVar7->schema = pRVar6;
        }
      }
    }
    else if (sVar2 == 4) {
      interface._reader.nestingLimit = node._reader.nestingLimit;
      interface._reader._44_4_ = node._reader._44_4_;
      interface._reader.data = node._reader.data;
      interface._reader.pointers = node._reader.pointers;
      interface._reader.segment = node._reader.segment;
      interface._reader.capTable = node._reader.capTable;
      capnp::schema::Node::Const::Reader::getType(&local_60,(Reader *)&interface);
      local_170.ptr.isSet = (bindings->ptr).isSet;
      if (local_170.ptr.isSet == true) {
        local_170.ptr.field_1.value.ptr = (bindings->ptr).field_1.value.ptr;
        local_170.ptr.field_1.value.size_ = (bindings->ptr).field_1.value.size_;
      }
      type._reader.capTable = local_60._reader.capTable;
      type._reader.segment = local_60._reader.segment;
      type._reader.data = local_60._reader.data;
      type._reader.pointers = local_60._reader.pointers;
      type._reader.dataSize = local_60._reader.dataSize;
      type._reader.pointerCount = local_60._reader.pointerCount;
      type._reader._38_2_ = local_60._reader._38_2_;
      type._reader.nestingLimit = local_60._reader.nestingLimit;
      type._reader._44_4_ = local_60._reader._44_4_;
      pRVar6 = makeDepSchema(this,type,scopeName,&local_170);
      if (pRVar6 != (RawBrandedSchema *)0x0) {
        pDVar7 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>(&deps);
        *(undefined8 *)pDVar7 = 0;
        pDVar7->location = 0x5000000;
        pDVar7->schema = pRVar6;
      }
    }
  }
  pRVar4 = deps.builder.pos;
  pDVar7 = deps.builder.ptr;
  if (deps.builder.ptr != deps.builder.pos) {
    lVar10 = (long)deps.builder.pos - (long)deps.builder.ptr;
    uVar5 = lVar10 >> 4;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<capnp::_::RawBrandedSchema::Dependency*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
              (deps.builder.ptr,deps.builder.pos,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x101) {
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar7,pRVar4);
    }
    else {
      pDVar11 = pDVar7 + 0x10;
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar7,pDVar11);
      for (; pDVar11 != pRVar4; pDVar11 = pDVar11 + 1) {
        std::
        __unguarded_linear_insert<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Val_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                  (pDVar11);
      }
    }
  }
  AVar12.size_ = (long)deps.builder.pos - (long)deps.builder.ptr >> 4;
  AVar12.ptr = deps.builder.ptr;
  AVar12 = copyDeduped<capnp::_::RawBrandedSchema::Dependency>(this,AVar12);
  kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::dispose(&deps.builder);
  return AVar12;
}

Assistant:

kj::ArrayPtr<const _::RawBrandedSchema::Dependency>
SchemaLoader::Impl::makeBrandedDependencies(
    const _::RawSchema* schema,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> bindings) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  kj::Vector<_::RawBrandedSchema::Dependency> deps;

  schema::Node::Reader node = readMessageUnchecked<schema::Node>(schema->encodedNode);

#define ADD_ENTRY(kind, index, make) \
    if (const _::RawBrandedSchema* dep = make) { \
      auto& slot = deps.add(); \
      memset(&slot, 0, sizeof(slot)); \
      slot.location = _::RawBrandedSchema::makeDepLocation( \
        _::RawBrandedSchema::DepKind::kind, index); \
      slot.schema = dep; \
    }

  switch (node.which()) {
    case schema::Node::FILE:
    case schema::Node::ENUM:
    case schema::Node::ANNOTATION:
      break;

    case schema::Node::CONST:
      ADD_ENTRY(CONST_TYPE, 0, makeDepSchema(
          node.getConst().getType(), scopeName, bindings));
      break;

    case schema::Node::STRUCT: {
      auto fields = node.getStruct().getFields();
      for (auto i: kj::indices(fields)) {
        auto field = fields[i];
        switch (field.which()) {
          case schema::Field::SLOT:
            ADD_ENTRY(FIELD, i, makeDepSchema(
                field.getSlot().getType(), scopeName, bindings))
            break;
          case schema::Field::GROUP: {
            const _::RawSchema* group = loadEmpty(
                field.getGroup().getTypeId(),
                "(unknown group type)", schema::Node::STRUCT, true);
            KJ_IF_MAYBE(b, bindings) {
              ADD_ENTRY(FIELD, i, makeBranded(group, *b));
            } else {
              ADD_ENTRY(FIELD, i, getUnbound(group));
            }
            break;
          }
        }
      }
      break;
    }

    case schema::Node::INTERFACE: {
      auto interface = node.getInterface();
      {
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          auto superclass = superclasses[i];
          ADD_ENTRY(SUPERCLASS, i, makeDepSchema(
              superclass.getId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              superclass.getBrand(), scopeName, bindings))
        }
      }
      {
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_ENTRY(METHOD_PARAMS, i, makeDepSchema(
              method.getParamStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getParamBrand(), scopeName, bindings))
          ADD_ENTRY(METHOD_RESULTS, i, makeDepSchema(
              method.getResultStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getResultBrand(), scopeName, bindings))
        }
      }
      break;
    }
  }